

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcLinkCodeWithModuleName(char *bytecode,char *moduleName)

{
  bool bVar1;
  int iVar2;
  nullres nVar3;
  TraceScope traceScope;
  OutputContext local_250;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcLinkCodeWithModuleName::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&nullcLinkCodeWithModuleName::token), iVar2 != 0)) {
    nullcLinkCodeWithModuleName::token = NULLC::TraceGetToken("nullc","nullcLinkCode");
    __cxa_guard_release(&nullcLinkCodeWithModuleName::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,nullcLinkCodeWithModuleName::token);
  bVar1 = Linker::LinkCode(NULLC::linker,bytecode,moduleName,true);
  if (!bVar1) {
    NULLC::nullcLastError = Linker::GetLinkError(NULLC::linker);
    nVar3 = '\0';
    goto LAB_0010b95d;
  }
  NULLC::nullcLastError = Linker::GetLinkError(NULLC::linker);
  local_250.stream = (void *)0x0;
  local_250.openStream = (_func_void_ptr_char_ptr *)NULLC::openStream;
  local_250.writeStream = (_func_void_void_ptr_char_ptr_uint *)NULLC::writeStream;
  local_250.closeStream = (_func_void_void_ptr *)NULLC::closeStream;
  local_250.outputBuf = NULLC::outputBuf;
  local_250.outputBufSize = 0x2000;
  local_250.outputBufPos = 0;
  local_250.tempBuf = NULLC::tempOutputBuf;
  local_250.tempBufSize = 0x4000;
  if ((NULLC::enableLogFiles == '\x01') &&
     (local_250.stream = (void *)(*(code *)NULLC::openStream)("link_reg_vm.txt"),
     local_250.stream != (void *)0x0)) {
    Linker::SaveRegVmListing(NULLC::linker,&local_250,false);
    (*local_250.closeStream)(local_250.stream);
    local_250.stream = (void *)0x0;
  }
  if ((NULLC::currExec != 1) ||
     (bVar1 = ExecutorX86::TranslateToNative
                        (NULLC::executorX86,(bool)NULLC::enableLogFiles,&local_250), bVar1)) {
    if (NULLC::currExec == 2) {
      NULLC::nullcLastError = "LLVM JIT isn\'t available";
      goto LAB_0010b94a;
    }
    if (NULLC::currExec == 0) {
      ExecutorRegVm::UpdateInstructionPointer(NULLC::executorRegVm);
    }
    nVar3 = '\x01';
    if (NULLC::enableExternalDebugger == '\x01') {
      Linker::CollectDebugInfo(NULLC::linker,&NULLC::executorX86->instAddress);
    }
  }
  else {
    NULLC::nullcLastError = ExecutorX86::GetErrorMessage(NULLC::executorX86);
LAB_0010b94a:
    nVar3 = '\0';
  }
  OutputContext::~OutputContext(&local_250);
LAB_0010b95d:
  NULLC::TraceScope::~TraceScope(&traceScope);
  return nVar3;
}

Assistant:

nullres nullcLinkCodeWithModuleName(const char *bytecode, const char *moduleName)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcLinkCode");

#ifndef NULLC_NO_EXECUTOR
	if(!linker->LinkCode(bytecode, moduleName, true))
	{
		nullcLastError = linker->GetLinkError();
		return false;
	}

	nullcLastError = linker->GetLinkError();

	OutputContext outputCtx;

	outputCtx.openStream = openStream;
	outputCtx.writeStream = writeStream;
	outputCtx.closeStream = closeStream;

	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = NULLC_OUTPUT_BUFFER_SIZE;

	outputCtx.tempBuf = tempOutputBuf;
	outputCtx.tempBufSize = NULLC_TEMP_OUTPUT_BUFFER_SIZE;

	if(enableLogFiles)
	{
		outputCtx.stream = outputCtx.openStream("link_reg_vm.txt");

		if(outputCtx.stream)
		{
			linker->SaveRegVmListing(outputCtx, false);

			outputCtx.closeStream(outputCtx.stream);
			outputCtx.stream = NULL;
		}
	}
#else
	(void)bytecode;
	(void)moduleName;

	nullcLastError = "No executor available, compile library without NULLC_NO_EXECUTOR";
#endif

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		if(!executorX86->TranslateToNative(enableLogFiles, outputCtx))
		{
			nullcLastError = executorX86->GetErrorMessage();
			return false;
		}
#else
		nullcLastError = "X86 JIT isn't available";
		return false;
#endif
	}

	if(currExec == NULLC_LLVM)
	{
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
		if(!executorLLVM->TranslateToNative())
		{
			nullcLastError = executorLLVM->GetErrorMessage();
			return false;
		}
#else
		nullcLastError = "LLVM JIT isn't available";
		return false;
#endif
	}

#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		executorRegVm->UpdateInstructionPointer();

#ifdef NULLC_BUILD_X86_JIT
	if(enableExternalDebugger)
		linker->CollectDebugInfo(&executorX86->instAddress);
#else
	if(enableExternalDebugger)
		linker->CollectDebugInfo(NULL);
#endif

#endif

#ifndef NULLC_NO_EXECUTOR
	return true;
#else
	return false;
#endif
}